

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.c
# Opt level: O3

ktx_error_code_e
ktxTexture_CreateFromStream
          (ktxStream *pStream,ktxTextureCreateFlags createFlags,ktxTexture **newTex)

{
  ktx_error_code_e kVar1;
  ktxTexture2 *This;
  ktxHeaderUnion_ header;
  KTX_header2 local_78;
  
  if (pStream == (ktxStream *)0x0) {
    __assert_fail("pStream != NULL && pFileType != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x112,
                  "ktx_error_code_e ktxDetermineFileType_(ktxStream *, ktxFileType_ *, ktxHeaderUnion_ *)"
                 );
  }
  if ((pStream->data).file == (FILE *)0x0) {
    __assert_fail("pStream->data.mem != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x113,
                  "ktx_error_code_e ktxDetermineFileType_(ktxStream *, ktxFileType_ *, ktxHeaderUnion_ *)"
                 );
  }
  if (2 < pStream->type - eStreamTypeFile) {
    __assert_fail("pStream->type == eStreamTypeFile || pStream->type == eStreamTypeMemory || pStream->type == eStreamTypeCustom"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture.c"
                  ,0x116,
                  "ktx_error_code_e ktxDetermineFileType_(ktxStream *, ktxFileType_ *, ktxHeaderUnion_ *)"
                 );
  }
  kVar1 = (*pStream->read)(pStream,&local_78,0xc);
  if (kVar1 == KTX_SUCCESS) {
    if (local_78.identifier._8_4_ == 0xa1a0a0d && local_78.identifier._0_8_ == -0x44cecedfa7abb455)
    {
      kVar1 = (*pStream->read)(pStream,&local_78.vkFormat,0x34);
      if (kVar1 != KTX_SUCCESS) {
        return kVar1;
      }
      This = (ktxTexture2 *)calloc(1,0x90);
      if (This == (ktxTexture2 *)0x0) {
        return KTX_OUT_OF_MEMORY;
      }
      kVar1 = ktxTexture1_constructFromStreamAndHeader
                        ((ktxTexture1 *)This,pStream,(KTX_header *)&local_78,createFlags);
    }
    else {
      if (local_78.identifier._8_4_ != 0xa1a0a0d || local_78.identifier._0_8_ != -0x44cfcddfa7abb455
         ) {
        return KTX_UNKNOWN_FILE_FORMAT;
      }
      kVar1 = (*pStream->read)(pStream,&local_78.vkFormat,0x44);
      if (kVar1 != KTX_SUCCESS) {
        return kVar1;
      }
      This = (ktxTexture2 *)calloc(1,0xa8);
      if (This == (ktxTexture2 *)0x0) {
        return KTX_OUT_OF_MEMORY;
      }
      kVar1 = ktxTexture2_constructFromStreamAndHeader(This,pStream,&local_78,createFlags);
    }
    if (kVar1 != KTX_SUCCESS) {
      free(This);
      This = (ktxTexture2 *)0x0;
    }
    *newTex = (ktxTexture *)This;
    return kVar1;
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxTexture_CreateFromStream(ktxStream* pStream,
                            ktxTextureCreateFlags createFlags,
                            ktxTexture** newTex)
{
    ktxHeaderUnion_ header;
    ktxFileType_ fileType;
    KTX_error_code result;
    ktxTexture* tex;

    result = ktxDetermineFileType_(pStream, &fileType, &header);
    if (result != KTX_SUCCESS)
        return result;

    if (fileType == KTX1) {
        ktxTexture1* tex1 = (ktxTexture1*)malloc(sizeof(ktxTexture1));
        if (tex1 == NULL)
            return KTX_OUT_OF_MEMORY;
        memset(tex1, 0, sizeof(ktxTexture1));
        result = ktxTexture1_constructFromStreamAndHeader(tex1, pStream,
                                                          &header.ktx,
                                                          createFlags);
        tex = ktxTexture(tex1);
    } else {
        ktxTexture2* tex2 = (ktxTexture2*)malloc(sizeof(ktxTexture2));
        if (tex2 == NULL)
            return KTX_OUT_OF_MEMORY;
        memset(tex2, 0, sizeof(ktxTexture2));
        result = ktxTexture2_constructFromStreamAndHeader(tex2, pStream,
                                                          &header.ktx2,
                                                          createFlags);
        tex = ktxTexture(tex2);
    }

    if (result == KTX_SUCCESS)
        *newTex = (ktxTexture*)tex;
    else {
        free(tex);
        *newTex = NULL;
    }
    return result;
}